

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfCopyNamedBufferSubData(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  deUint32 dVar18;
  RenderContext *pRVar19;
  undefined4 extraout_var;
  GLuint local_38;
  GLuint not_a_buffer_name;
  undefined4 local_28;
  GLuint local_24;
  GLubyte dummy_data [4];
  GLuint buffer_w;
  GLuint buffer_r;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar20;
  
  pRVar19 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar17 = (*pRVar19->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar17);
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  local_24 = 0;
  local_28 = 0;
  (**(code **)(lVar20 + 0x3b8))(1,dummy_data);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc57);
  (*this->m_pNamedBufferStorage)((GLuint)dummy_data,4,&local_28,0x43);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc5b);
  (**(code **)(lVar20 + 0x3b8))(1,&local_24);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc5e);
  (*this->m_pNamedBufferStorage)(local_24,4,&local_28,0x43);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xc62);
  local_38 = 0;
  do {
    local_38 = local_38 + 1;
    cVar1 = (**(code **)(lVar20 + 0xc68))();
  } while (cVar1 != '\0');
  (*this->m_pCopyNamedBufferSubData)(local_38,local_24,0,0,4);
  bVar2 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                           " if readBuffer is not the name of an existing buffer object.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_38,0,0,4);
  bVar3 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                           " if writeBuffer is not the name of an existing buffer object.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,-1,0,4);
  bVar4 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if readOffset is negative.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,-1,4);
  bVar5 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if writeOffset is negative.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,-1);
  bVar6 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,"if size is negative.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,8);
  bVar7 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                           " if size is greater than the size of the source buffer object.");
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,2,0,4);
  bVar8 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                           " if readOffset+size is greater than the size of the source buffer object."
                          );
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,2,4);
  bVar9 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                           " if writeOffset+size is greater than the size of the source buffer object."
                          );
  (*this->m_pCopyNamedBufferSubData)(local_24,local_24,0,0,4);
  bVar10 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x501,
                            " if the source and destination are the same buffer object, and the ranges [readOffset,readOffset+size) and [writeOffset,writeOffset+size) overlap."
                           );
  (*this->m_pMapNamedBuffer)((GLuint)dummy_data,35000);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcb8);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  bVar11 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                            " if the source buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcc0);
  (*this->m_pMapNamedBuffer)(local_24,35000);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcc6);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  bVar12 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                            " if the destination buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(local_24);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcce);
  (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,1);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcd4);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  bVar13 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                            " if the source buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcdc);
  (*this->m_pMapNamedBufferRange)(local_24,0,4,1);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xce2);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  bVar14 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0x502,
                            " if the destination buffer object is mapped with MapBuffer.");
  (*this->m_pUnmapNamedBuffer)(local_24);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcea);
  (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,0x41);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcf1);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  bVar15 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0,
                            " if the source buffer object is mapped using MapBufferRange with the MAP_PERSISTENT bit set in the access flags."
                           );
  (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xcfb);
  (*this->m_pMapNamedBufferRange)(local_24,0,4,0x41);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd02);
  (*this->m_pCopyNamedBufferSubData)((GLuint)dummy_data,local_24,0,0,4);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd06);
  bVar16 = ErrorCheckAndLog(this,"glCopyNamedBufferSubData",0,
                            " if the destination buffer object is mapped using MapBufferRange with the MAP_PERSISTENT bit set in the access flags."
                           );
  (*this->m_pUnmapNamedBuffer)(local_24);
  dVar18 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar18,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd0d);
  if (dummy_data != (GLubyte  [4])0x0) {
    (**(code **)(lVar20 + 0x438))(1,dummy_data);
    dummy_data[0] = '\0';
    dummy_data[1] = '\0';
    dummy_data[2] = '\0';
    dummy_data[3] = '\0';
  }
  if (dummy_data != (GLubyte  [4])0x0) {
    (**(code **)(lVar20 + 0x438))(1,dummy_data);
  }
  return bVar16 && (bVar15 &&
                   (bVar14 &&
                   (bVar13 &&
                   (bVar12 &&
                   (bVar11 &&
                   (bVar10 &&
                   (bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && bVar2))))))
                   )))))));
}

Assistant:

bool ErrorsTest::TestErrorsOfCopyNamedBufferSubData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer_r	  = 0;
	glw::GLuint  buffer_w	  = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer_r);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer_r, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		gl.createBuffers(1, &buffer_w);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer_w, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pCopyNamedBufferSubData(not_a_buffer_name, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if readBuffer is not the name of an existing buffer object.");

			m_pCopyNamedBufferSubData(buffer_r, not_a_buffer_name, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if writeBuffer is not the name of an existing buffer object.");
		}

		/* Test negative read offset error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, -1, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if readOffset is negative.");
		}

		/* Test negative write offset error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, -1, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if writeOffset is negative.");
		}

		/* Test negative size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, -1);

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE, "if size is negative.");
		}

		/* Test overflow size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, 2 * sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if size is greater than the size of the source buffer object.");
		}

		/* Test overflow read offset and size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, sizeof(dummy_data) / 2, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if readOffset+size is greater than the size of the source buffer object.");
		}

		/* Test overflow write offset and size error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, sizeof(dummy_data) / 2, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if writeOffset+size is greater than the size of the source buffer object.");
		}

		/* Test same buffer overlapping error behavior. */
		{
			/* Test. */
			m_pCopyNamedBufferSubData(buffer_w, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_VALUE,
									  " if the source and destination are the same buffer object, and the ranges"
									  " [readOffset,readOffset+size) and [writeOffset,writeOffset+size) overlap.");
		}

		/* Test of mapped read buffer copy error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer_r, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the source buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped write buffer copy error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer_w, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the destination buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped read buffer copy error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer_r, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the source buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped write buffer copy error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer_w, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the destination buffer object is mapped with MapBuffer.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped read buffer copy error with behavior verification. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer_r, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_NO_ERROR,
									  " if the source buffer object is mapped using "
									  "MapBufferRange with the MAP_PERSISTENT bit "
									  "set in the access flags.");

			m_pUnmapNamedBuffer(buffer_r);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped write buffer copy error with behavior verification. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer_w, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pCopyNamedBufferSubData(buffer_r, buffer_w, 0, 0, sizeof(dummy_data));

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");
			is_ok &= ErrorCheckAndLog("glCopyNamedBufferSubData", GL_NO_ERROR,
									  " if the destination buffer object is mapped using "
									  "MapBufferRange with the MAP_PERSISTENT bit "
									  "set in the access flags.");

			m_pUnmapNamedBuffer(buffer_w);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer_r)
	{
		gl.deleteBuffers(1, &buffer_r);

		buffer_r = 0;
	}

	if (buffer_r)
	{
		gl.deleteBuffers(1, &buffer_r);

		buffer_r = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}